

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_repeatedMathParsePrintBehaviour_Test::~Parser_repeatedMathParsePrintBehaviour_Test
          (Parser_repeatedMathParsePrintBehaviour_Test *this)

{
  Parser_repeatedMathParsePrintBehaviour_Test *this_local;
  
  ~Parser_repeatedMathParsePrintBehaviour_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, repeatedMathParsePrintBehaviour)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component\">\n"
        "    <variable name=\"A\" initial_value=\"1.0\"/>\n"
        "    <variable name=\"B\" initial_value=\"-1.0\"/>\n"
        "    <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply>\n"
        "        <eq/>\n"
        "        <ci>C</ci>\n"
        "        <apply>\n"
        "          <plus/>\n"
        "          <ci>A</ci>\n"
        "          <ci>B</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::PrinterPtr printer = libcellml::Printer::create();

    libcellml::ModelPtr model1 = parser->parseModel(in);
    std::string output1 = printer->printModel(model1);

    libcellml::ModelPtr model2 = parser->parseModel(output1);
    std::string output2 = printer->printModel(model2);

    EXPECT_EQ(in, output2);
}